

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::analysis::Type::GetDecorationStr_abi_cxx11_
          (string *__return_storage_ptr__,Type *this)

{
  pointer pvVar1;
  size_t i;
  ulong __n;
  char *pcVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration;
  pointer this_00;
  ostringstream oss;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"[[");
  pvVar1 = (this->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->decorations_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar1; this_00 = this_00 + 1
      ) {
    std::operator<<((ostream *)local_1a8,"(");
    for (__n = 0; __n < (ulong)((long)(this_00->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 2);
        __n = __n + 1) {
      pcVar2 = ", ";
      if (__n == 0) {
        pcVar2 = "";
      }
      std::operator<<((ostream *)local_1a8,pcVar2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,__n);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    }
    std::operator<<((ostream *)local_1a8,")");
  }
  std::operator<<((ostream *)local_1a8,"]]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::GetDecorationStr() const {
  std::ostringstream oss;
  oss << "[[";
  for (const auto& decoration : decorations_) {
    oss << "(";
    for (size_t i = 0; i < decoration.size(); ++i) {
      oss << (i > 0 ? ", " : "");
      oss << decoration.at(i);
    }
    oss << ")";
  }
  oss << "]]";
  return oss.str();
}